

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O1

void __thiscall
QHttpNetworkConnectionChannel::_q_connected_abstract_socket
          (QHttpNetworkConnectionChannel *this,QAbstractSocket *absSocket)

{
  long *plVar1;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  NetworkLayerProtocol NVar5;
  ConnectionType CVar6;
  long lVar7;
  QHttp2ProtocolHandler *this_00;
  QHttpProtocolHandler *this_01;
  QObject *pQVar8;
  QNetworkConnectionMonitor *this_02;
  long in_FS_OFFSET;
  shared_ptr<QSslContext> sVar9;
  PrivateShared *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 local_60 [8];
  undefined1 local_58 [16];
  QMetaTypeInterface *local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x7c) == 1) ||
     (*(int *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x7c) == 4)) {
    cVar3 = QTimer::isActive();
    if (cVar3 != '\0') {
      QTimer::stop();
    }
    if (*(int *)(this + 0xe8) == 1) {
      lVar7 = *(long *)(*(long *)(this + 0xf8) + 8);
LAB_0020a4f6:
      *(undefined4 *)(lVar7 + 0x7c) = 3;
    }
    else {
      if (*(int *)(this + 0xe8) == 0) {
        lVar7 = *(long *)(*(long *)(this + 0xf8) + 8);
      }
      else {
        QAbstractSocket::peerAddress((QAbstractSocket *)local_58);
        NVar5 = QHostAddress::protocol((QHostAddress *)local_58);
        QHostAddress::~QHostAddress((QHostAddress *)local_58);
        lVar7 = *(long *)(*(long *)(this + 0xf8) + 8);
        if (NVar5 != IPv4Protocol) goto LAB_0020a4f6;
      }
      *(undefined4 *)(lVar7 + 0x7c) = 2;
    }
    QHttpNetworkConnectionPrivate::networkLayerDetected
              (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8),
               *(NetworkLayerProtocol *)(this + 0xe8));
    if ((1 < *(int *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xa0)) &&
       (*(char *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x9a) == '\0')) {
      if (*(int *)(*(long *)(this + 0xf0) + 4) == 0) {
        pQVar8 = (QObject *)0x0;
      }
      else {
        pQVar8 = *(QObject **)(this + 0xf8);
      }
      local_58._0_8_ = (PrivateShared *)0x0;
      local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (pQVar8,"_q_startNextRequest",QueuedConnection,1,(void **)local_58,
                 (char **)(local_58 + 8),local_48);
    }
LAB_0020a5a4:
    QVariant::QVariant((QVariant *)local_58,1);
    (**(code **)(*(long *)absSocket + 0x120))(absSocket,1,(QVariant *)local_58);
    QVariant::~QVariant((QVariant *)local_58);
    *(undefined4 *)(this + 0xb0) = 0;
    bVar4 = QNetworkConnectionMonitor::isEnabled();
    if (bVar4) {
      this_02 = (QNetworkConnectionMonitor *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x130);
      bVar4 = QNetworkConnectionMonitor::isMonitoring(this_02);
      if (!bVar4) {
        QAbstractSocket::localAddress((QAbstractSocket *)local_58);
        QAbstractSocket::peerAddress((QAbstractSocket *)local_60);
        bVar4 = QNetworkConnectionMonitor::setTargets
                          (this_02,(QHostAddress *)local_58,(QHostAddress *)local_60);
        QHostAddress::~QHostAddress((QHostAddress *)local_60);
        QHostAddress::~QHostAddress((QHostAddress *)local_58);
        if (bVar4) {
          QNetworkConnectionMonitor::startMonitoring(this_02);
        }
      }
    }
    if ((this[0x18] != (QHttpNetworkConnectionChannel)0x0) ||
       (this[0x58] == (QHttpNetworkConnectionChannel)0x1)) {
      QHttpNetworkConnection::sslContext(*(QHttpNetworkConnection **)(this + 0xf8));
      uVar2 = local_58._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      if ((PrivateShared *)uVar2 == (PrivateShared *)0x0) {
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        sVar9 = QSslSocketPrivate::sslContext((QSslSocketPrivate *)local_58,(QSslSocket *)absSocket)
        ;
        uVar2 = local_58._8_8_;
        if ((PrivateShared *)local_58._0_8_ != (PrivateShared *)0x0) {
          local_70 = (PrivateShared *)local_58._0_8_;
          local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
          local_58._0_8_ = (PrivateShared *)0x0;
          sVar9.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_70;
          QHttpNetworkConnection::setSslContext(*(QHttpNetworkConnection **)(this + 0xf8),sVar9);
          if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
      }
      goto LAB_0020a7dd;
    }
    CVar6 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
    *(undefined4 *)(this + 0x20) = 0;
    if (CVar6 != ConnectionTypeHTTP2Direct) {
      CVar6 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
      if (CVar6 == ConnectionTypeHTTP2) {
        this_01 = (QHttpProtocolHandler *)operator_new(0x40);
        QHttpProtocolHandler::QHttpProtocolHandler(this_01,(QHttpNetworkConnectionChannel *)this);
        plVar1 = *(long **)(this + 0x78);
        *(QHttpProtocolHandler **)(this + 0x78) = this_01;
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
      }
      this[0x88] = (QHttpNetworkConnectionChannel)0x0;
      if (*(long *)(this + 0x38) == 0) {
        QHttpNetworkConnectionPrivate::dequeueRequest
                  (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8),
                   &absSocket->super_QIODevice);
      }
      if (*(long *)(this + 0x38) != 0) {
        if (CVar6 == ConnectionTypeHTTP2) {
          QHttpNetworkConnection::http2Parameters((QHttpNetworkConnection *)local_58);
          Http2::appendProtocolUpgradeHeaders
                    ((QHttp2Configuration *)local_58,(QHttpNetworkRequest *)(this + 0x28));
          QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)local_58);
        }
        if (this[0x1a] == (QHttpNetworkConnectionChannel)0x1) {
          this[0x1d] = (QHttpNetworkConnectionChannel)0x1;
        }
        else {
          (**(code **)(**(long **)(this + 0x78) + 0x20))();
        }
      }
      goto LAB_0020a7dd;
    }
    this_00 = (QHttp2ProtocolHandler *)operator_new(0x58);
    QHttp2ProtocolHandler::QHttp2ProtocolHandler(this_00,(QHttpNetworkConnectionChannel *)this);
    plVar1 = *(long **)(this + 0x78);
    *(QHttp2ProtocolHandler **)(this + 0x78) = this_00 + 0x10;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if ((*(long *)(this + 0x80) == 0) || (*(long *)(*(long *)(this + 0x80) + 0x30) < 1))
    goto LAB_0020a7dd;
  }
  else {
    if (((*(int *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x7c) != 2) ||
        ((*(uint *)(this + 0xe8) & 0xfffffffd) == 0)) &&
       (*(uint *)(this + 0xe8) - 1 < 2 ||
        *(int *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x7c) != 3)) goto LAB_0020a5a4;
    close(this,(int)absSocket);
  }
  if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
    pQVar8 = (QObject *)0x0;
  }
  else {
    pQVar8 = *(QObject **)(this + 0xf8);
  }
  local_58._0_8_ = (PrivateShared *)0x0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48[0] = (QMetaTypeInterface *)0x0;
  QMetaObject::invokeMethodImpl
            (pQVar8,"_q_startNextRequest",QueuedConnection,1,(void **)local_58,
             (char **)(local_58 + 8),local_48);
LAB_0020a7dd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::_q_connected_abstract_socket(QAbstractSocket *absSocket)
{
    // For the Happy Eyeballs we need to check if this is the first channel to connect.
    if (connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::HostLookupPending || connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::IPv4or6) {
        if (connection->d_func()->delayedConnectionTimer.isActive())
            connection->d_func()->delayedConnectionTimer.stop();
        if (networkLayerPreference == QAbstractSocket::IPv4Protocol)
            connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
        else if (networkLayerPreference == QAbstractSocket::IPv6Protocol)
            connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
        else {
            if (absSocket->peerAddress().protocol() == QAbstractSocket::IPv4Protocol)
                connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
            else
                connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
        }
        connection->d_func()->networkLayerDetected(networkLayerPreference);
        if (connection->d_func()->activeChannelCount > 1 && !connection->d_func()->encrypt)
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    } else {
        bool anyProtocol = networkLayerPreference == QAbstractSocket::AnyIPProtocol;
        if (((connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::IPv4)
             && (networkLayerPreference != QAbstractSocket::IPv4Protocol && !anyProtocol))
            || ((connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::IPv6)
                && (networkLayerPreference != QAbstractSocket::IPv6Protocol && !anyProtocol))) {
            close();
            // This is the second connection so it has to be closed and we can schedule it for another request.
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
        //The connections networkLayerState had already been decided.
    }

    // improve performance since we get the request sent by the kernel ASAP
    //absSocket->setSocketOption(QAbstractSocket::LowDelayOption, 1);
    // We have this commented out now. It did not have the effect we wanted. If we want to
    // do this properly, Qt has to combine multiple HTTP requests into one buffer
    // and send this to the kernel in one syscall and then the kernel immediately sends
    // it as one TCP packet because of TCP_NODELAY.
    // However, this code is currently not in Qt, so we rely on the kernel combining
    // the requests into one TCP packet.

    // not sure yet if it helps, but it makes sense
    absSocket->setSocketOption(QAbstractSocket::KeepAliveOption, 1);

    pipeliningSupported = QHttpNetworkConnectionChannel::PipeliningSupportUnknown;

    if (QNetworkConnectionMonitor::isEnabled()) {
        auto connectionPrivate = connection->d_func();
        if (!connectionPrivate->connectionMonitor.isMonitoring()) {
            // Now that we have a pair of addresses, we can start monitoring the
            // connection status to handle its loss properly.
            if (connectionPrivate->connectionMonitor.setTargets(absSocket->localAddress(), absSocket->peerAddress()))
                connectionPrivate->connectionMonitor.startMonitoring();
        }
    }

    // ### FIXME: if the server closes the connection unexpectedly, we shouldn't send the same broken request again!
    //channels[i].reconnectAttempts = 2;
    if (ssl || pendingEncrypt) { // FIXME: Didn't work properly with pendingEncrypt only, we should refactor this into an EncrypingState
#ifndef QT_NO_SSL
        if (!connection->sslContext()) {
            // this socket is making the 1st handshake for this connection,
            // we need to set the SSL context so new sockets can reuse it
            if (auto socketSslContext = QSslSocketPrivate::sslContext(static_cast<QSslSocket*>(absSocket)))
                connection->setSslContext(std::move(socketSslContext));
        }
#endif
    } else if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2Direct) {
        state = QHttpNetworkConnectionChannel::IdleState;
        protocolHandler.reset(new QHttp2ProtocolHandler(this));
        if (h2RequestsToSend.size() > 0) {
            // In case our peer has sent us its settings (window size, max concurrent streams etc.)
            // let's give _q_receiveReply a chance to read them first ('invokeMethod', QueuedConnection).
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
        }
    } else {
        state = QHttpNetworkConnectionChannel::IdleState;
        const bool tryProtocolUpgrade = connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2;
        if (tryProtocolUpgrade) {
            // For HTTP/1.1 it's already created and never reset.
            protocolHandler.reset(new QHttpProtocolHandler(this));
        }
        switchedToHttp2 = false;

        if (!reply)
            connection->d_func()->dequeueRequest(absSocket);

        if (reply) {
            if (tryProtocolUpgrade) {
                // Let's augment our request with some magic headers and try to
                // switch to HTTP/2.
                Http2::appendProtocolUpgradeHeaders(connection->http2Parameters(), &request);
            }
            sendRequest();
        }
    }
}